

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlStrndup(xmlChar *cur,int len)

{
  xmlChar *__dest;
  ulong __n;
  
  if (-1 < len && cur != (xmlChar *)0x0) {
    __n = (ulong)(uint)len;
    __dest = (xmlChar *)(*xmlMalloc)(__n + 1);
    if (__dest != (xmlChar *)0x0) {
      memcpy(__dest,cur,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStrndup(const xmlChar *cur, int len) {
    xmlChar *ret;

    if ((cur == NULL) || (len < 0)) return(NULL);
    ret = xmlMalloc((size_t) len + 1);
    if (ret == NULL) {
        return(NULL);
    }
    memcpy(ret, cur, len);
    ret[len] = 0;
    return(ret);
}